

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

GLboolean createWindow(_GLFWwindow *window,_GLFWwndconfig *wndconfig)

{
  int iVar1;
  XVisualInfo *pXVar2;
  Colormap CVar3;
  Window WVar4;
  undefined8 *puVar5;
  ulong *puVar6;
  size_t sVar7;
  XIC p_Var8;
  undefined8 in_stack_fffffffffffffe38;
  uint uVar9;
  undefined8 in_stack_fffffffffffffe40;
  undefined4 uVar11;
  undefined8 uVar10;
  undefined8 local_198;
  Atom version;
  undefined4 local_188;
  undefined4 uStack_184;
  uchar mask [1];
  XIEventMask eventmask;
  XClassHint *hint;
  XSizeHints *hints_2;
  XWMHints *hints_1;
  Atom local_158;
  pid_t pid;
  Atom protocols [2];
  undefined8 uStack_140;
  int count;
  anon_struct_40_5_7b6a5d69 hints;
  XSetWindowAttributes attributes;
  XVisualInfo *vi;
  XSetWindowAttributes wa;
  unsigned_long wamask;
  _GLFWwndconfig *wndconfig_local;
  _GLFWwindow *window_local;
  
  uVar11 = (undefined4)((ulong)in_stack_fffffffffffffe40 >> 0x20);
  uVar9 = (uint)((ulong)in_stack_fffffffffffffe38 >> 0x20);
  pXVar2 = (window->glx).visual;
  CVar3 = XCreateColormap(_glfw.x11.display,_glfw.x11.root,pXVar2->visual,0);
  (window->x11).colormap = CVar3;
  wa.cursor = 0x2808;
  wa._88_8_ = (window->x11).colormap;
  wa.border_pixmap = 0;
  wa.save_under = 0x63807f;
  wa._68_4_ = 0;
  _glfwGrabXErrorHandler();
  uVar10 = CONCAT44(uVar11,pXVar2->depth);
  WVar4 = XCreateWindow(_glfw.x11.display,_glfw.x11.root,0,0,wndconfig->width,wndconfig->height,
                        (ulong)uVar9 << 0x20,uVar10,1,pXVar2->visual,wa.cursor,&vi);
  uVar11 = (undefined4)((ulong)uVar10 >> 0x20);
  (window->x11).handle = WVar4;
  _glfwReleaseXErrorHandler();
  if ((window->x11).handle == 0) {
    _glfwInputXError(0x10008,"X11: Failed to create window");
    window_local._7_1_ = '\0';
  }
  else {
    XSaveContext(_glfw.x11.display,(window->x11).handle,_glfw.x11.context,window);
    if (wndconfig->monitor == (_GLFWmonitor *)0x0) {
      if (wndconfig->decorated == '\0') {
        uStack_140 = 2;
        hints.functions = 0;
        XChangeProperty(_glfw.x11.display,(window->x11).handle,_glfw.x11.MOTIF_WM_HINTS,
                        _glfw.x11.MOTIF_WM_HINTS,0x20,0,&stack0xfffffffffffffec0,CONCAT44(uVar11,5))
        ;
      }
      if (((wndconfig->floating != '\0') && (_glfw.x11.NET_WM_STATE != 0)) &&
         (_glfw.x11.NET_WM_STATE_ABOVE != 0)) {
        sendEventToWM(window,_glfw.x11.NET_WM_STATE,1,_glfw.x11.NET_WM_STATE_ABOVE,0,1,0);
      }
    }
    else if ((_glfw.x11.NET_WM_STATE == 0) || (_glfw.x11.NET_WM_STATE_FULLSCREEN == 0)) {
      XChangeWindowAttributes(_glfw.x11.display,(window->x11).handle,0x200,&hints.status);
    }
    if (_glfw.x11.WM_DELETE_WINDOW != 0) {
      local_158 = _glfw.x11.WM_DELETE_WINDOW;
    }
    protocols[1]._5_3_ = 0;
    protocols[1]._4_1_ = _glfw.x11.WM_DELETE_WINDOW != 0;
    if (_glfw.x11.NET_WM_PING != 0) {
      *(Atom *)((long)&stack0xfffffffffffffea8 + (long)(int)protocols[1]._4_4_ * 8) =
           _glfw.x11.NET_WM_PING;
      protocols[1]._4_4_ = protocols[1]._4_4_ + 1;
    }
    if (protocols[1]._4_4_ != 0) {
      XSetWMProtocols(_glfw.x11.display,(window->x11).handle,&stack0xfffffffffffffea8,
                      protocols[1]._4_4_);
    }
    if (_glfw.x11.NET_WM_PID != 0) {
      hints_1._4_4_ = getpid();
      XChangeProperty(_glfw.x11.display,(window->x11).handle,_glfw.x11.NET_WM_PID,6,0x20,0,
                      (long)&hints_1 + 4,1);
    }
    puVar5 = (undefined8 *)XAllocWMHints();
    if (puVar5 == (undefined8 *)0x0) {
      _glfwInputError(0x10005,"X11: Failed to allocate WM hints");
      window_local._7_1_ = '\0';
    }
    else {
      *puVar5 = 2;
      *(undefined4 *)((long)puVar5 + 0xc) = 1;
      XSetWMHints(_glfw.x11.display,(window->x11).handle,puVar5);
      XFree(puVar5);
      puVar6 = (ulong *)XAllocSizeHints();
      *puVar6 = 0;
      if (wndconfig->monitor == (_GLFWmonitor *)0x0) {
        *puVar6 = *puVar6 | 4;
        *(undefined4 *)((long)puVar6 + 0xc) = 0;
        *(undefined4 *)(puVar6 + 1) = 0;
      }
      else {
        *puVar6 = *puVar6 | 4;
        _glfwPlatformGetMonitorPos
                  (wndconfig->monitor,(int *)(puVar6 + 1),(int *)((long)puVar6 + 0xc));
      }
      if (wndconfig->resizable == '\0') {
        *puVar6 = *puVar6 | 0x30;
        iVar1 = wndconfig->width;
        *(int *)(puVar6 + 4) = iVar1;
        *(int *)(puVar6 + 3) = iVar1;
        iVar1 = wndconfig->height;
        *(int *)((long)puVar6 + 0x24) = iVar1;
        *(int *)((long)puVar6 + 0x1c) = iVar1;
      }
      XSetWMNormalHints(_glfw.x11.display,(window->x11).handle,puVar6);
      XFree(puVar6);
      sVar7 = strlen(wndconfig->title);
      if (sVar7 != 0) {
        puVar5 = (undefined8 *)XAllocClassHint();
        *puVar5 = wndconfig->title;
        puVar5[1] = wndconfig->title;
        XSetClassHint(_glfw.x11.display,(window->x11).handle,puVar5);
        XFree(puVar5);
      }
      if (_glfw.x11.xi.available != '\0') {
        memset((void *)((long)&version + 7),0,1);
        local_188 = 2;
        uStack_184 = 1;
        version._7_1_ = version._7_1_ | 0x40;
        XISelectEvents(_glfw.x11.display,(window->x11).handle,&local_188,1);
      }
      if (_glfw.x11.XdndAware != 0) {
        local_198 = 5;
        XChangeProperty(_glfw.x11.display,(window->x11).handle,_glfw.x11.XdndAware,4,0x20,0,
                        &local_198,1);
      }
      _glfwPlatformSetWindowTitle(window,wndconfig->title);
      XRRSelectInput(_glfw.x11.display,(window->x11).handle,1);
      if (_glfw.x11.im != (XIM)0x0) {
        p_Var8 = (XIC)XCreateIC(_glfw.x11.im,"inputStyle",0x408,"clientWindow",(window->x11).handle,
                                "focusWindow",(window->x11).handle,0);
        (window->x11).ic = p_Var8;
      }
      _glfwPlatformGetWindowPos(window,&(window->x11).xpos,&(window->x11).ypos);
      _glfwPlatformGetWindowSize(window,&(window->x11).width,&(window->x11).height);
      window_local._7_1_ = '\x01';
    }
  }
  return window_local._7_1_;
}

Assistant:

static GLboolean createWindow(_GLFWwindow* window,
                              const _GLFWwndconfig* wndconfig)
{
    unsigned long wamask;
    XSetWindowAttributes wa;
    XVisualInfo* vi = _GLFW_X11_CONTEXT_VISUAL;

    // Every window needs a colormap
    // Create one based on the visual used by the current context
    // TODO: Decouple this from context creation

    window->x11.colormap = XCreateColormap(_glfw.x11.display,
                                           _glfw.x11.root,
                                           vi->visual,
                                           AllocNone);

    // Create the actual window
    {
        wamask = CWBorderPixel | CWColormap | CWEventMask;

        wa.colormap = window->x11.colormap;
        wa.border_pixel = 0;
        wa.event_mask = StructureNotifyMask | KeyPressMask | KeyReleaseMask |
                        PointerMotionMask | ButtonPressMask | ButtonReleaseMask |
                        ExposureMask | FocusChangeMask | VisibilityChangeMask |
                        EnterWindowMask | LeaveWindowMask | PropertyChangeMask;

        _glfwGrabXErrorHandler();

        window->x11.handle = XCreateWindow(_glfw.x11.display,
                                           _glfw.x11.root,
                                           0, 0,
                                           wndconfig->width, wndconfig->height,
                                           0,          // Border width
                                           vi->depth,  // Color depth
                                           InputOutput,
                                           vi->visual,
                                           wamask,
                                           &wa);

        _glfwReleaseXErrorHandler();

        if (!window->x11.handle)
        {
            _glfwInputXError(GLFW_PLATFORM_ERROR,
                             "X11: Failed to create window");
            return GL_FALSE;
        }

        XSaveContext(_glfw.x11.display,
                     window->x11.handle,
                     _glfw.x11.context,
                     (XPointer) window);
    }

    if (wndconfig->monitor)
    {
        if (!_glfw.x11.NET_WM_STATE || !_glfw.x11.NET_WM_STATE_FULLSCREEN)
        {
            // This is the butcher's way of removing window decorations
            // Setting the override-redirect attribute on a window makes the
            // window manager ignore the window completely (ICCCM, section 4)
            // The good thing is that this makes undecorated full screen windows
            // easy to do; the bad thing is that we have to do everything
            // manually and some things (like iconify/restore) won't work at
            // all, as those are tasks usually performed by the window manager

            XSetWindowAttributes attributes;
            attributes.override_redirect = True;
            XChangeWindowAttributes(_glfw.x11.display,
                                    window->x11.handle,
                                    CWOverrideRedirect,
                                    &attributes);
        }
    }
    else
    {
        if (!wndconfig->decorated)
        {
            struct
            {
                unsigned long flags;
                unsigned long functions;
                unsigned long decorations;
                long input_mode;
                unsigned long status;
            } hints;

            hints.flags = 2;       // Set decorations
            hints.decorations = 0; // No decorations

            XChangeProperty(_glfw.x11.display, window->x11.handle,
                            _glfw.x11.MOTIF_WM_HINTS,
                            _glfw.x11.MOTIF_WM_HINTS, 32,
                            PropModeReplace,
                            (unsigned char*) &hints,
                            sizeof(hints) / sizeof(long));
        }

        if (wndconfig->floating)
        {
            if (_glfw.x11.NET_WM_STATE && _glfw.x11.NET_WM_STATE_ABOVE)
            {
                sendEventToWM(window,
                              _glfw.x11.NET_WM_STATE,
                              _NET_WM_STATE_ADD,
                              _glfw.x11.NET_WM_STATE_ABOVE,
                              0, 1, 0);
            }
        }
    }


    // Declare the WM protocols supported by GLFW
    {
        int count = 0;
        Atom protocols[2];

        // The WM_DELETE_WINDOW ICCCM protocol
        // Basic window close notification protocol
        if (_glfw.x11.WM_DELETE_WINDOW)
            protocols[count++] = _glfw.x11.WM_DELETE_WINDOW;

        // The _NET_WM_PING EWMH protocol
        // Tells the WM to ping the GLFW window and flag the application as
        // unresponsive if the WM doesn't get a reply within a few seconds
        if (_glfw.x11.NET_WM_PING)
            protocols[count++] = _glfw.x11.NET_WM_PING;

        if (count > 0)
        {
            XSetWMProtocols(_glfw.x11.display, window->x11.handle,
                            protocols, count);
        }
    }

    if (_glfw.x11.NET_WM_PID)
    {
        const pid_t pid = getpid();

        XChangeProperty(_glfw.x11.display,  window->x11.handle,
                        _glfw.x11.NET_WM_PID, XA_CARDINAL, 32,
                        PropModeReplace,
                        (unsigned char*) &pid, 1);
    }

    // Set ICCCM WM_HINTS property
    {
        XWMHints* hints = XAllocWMHints();
        if (!hints)
        {
            _glfwInputError(GLFW_OUT_OF_MEMORY,
                            "X11: Failed to allocate WM hints");
            return GL_FALSE;
        }

        hints->flags = StateHint;
        hints->initial_state = NormalState;

        XSetWMHints(_glfw.x11.display, window->x11.handle, hints);
        XFree(hints);
    }

    // Set ICCCM WM_NORMAL_HINTS property (even if no parts are set)
    {
        XSizeHints* hints = XAllocSizeHints();
        hints->flags = 0;

        if (wndconfig->monitor)
        {
            hints->flags |= PPosition;
            _glfwPlatformGetMonitorPos(wndconfig->monitor, &hints->x, &hints->y);
        }
        else
        {
            // HACK: Explicitly setting PPosition to any value causes some WMs,
            //       notably Compiz and Metacity, to honor the position of
            //       unmapped windows set by XMoveWindow
            hints->flags |= PPosition;
            hints->x = hints->y = 0;
        }

        if (!wndconfig->resizable)
        {
            hints->flags |= (PMinSize | PMaxSize);
            hints->min_width  = hints->max_width  = wndconfig->width;
            hints->min_height = hints->max_height = wndconfig->height;
        }

        XSetWMNormalHints(_glfw.x11.display, window->x11.handle, hints);
        XFree(hints);
    }

    // Set ICCCM WM_CLASS property
    // HACK: Until a mechanism for specifying the application name is added, the
    //       initial window title is used as the window class name
    if (strlen(wndconfig->title))
    {
        XClassHint* hint = XAllocClassHint();
        hint->res_name = (char*) wndconfig->title;
        hint->res_class = (char*) wndconfig->title;

        XSetClassHint(_glfw.x11.display, window->x11.handle, hint);
        XFree(hint);
    }

#if defined(_GLFW_HAS_XINPUT)
    if (_glfw.x11.xi.available)
    {
        // Select for XInput2 events

        XIEventMask eventmask;
        unsigned char mask[] = { 0 };

        eventmask.deviceid = 2;
        eventmask.mask_len = sizeof(mask);
        eventmask.mask = mask;
        XISetMask(mask, XI_Motion);

        XISelectEvents(_glfw.x11.display, window->x11.handle, &eventmask, 1);
    }
#endif /*_GLFW_HAS_XINPUT*/

    if (_glfw.x11.XdndAware)
    {
        // Announce support for Xdnd (drag and drop)
        const Atom version = 5;
        XChangeProperty(_glfw.x11.display, window->x11.handle,
                        _glfw.x11.XdndAware, XA_ATOM, 32,
                        PropModeReplace, (unsigned char*) &version, 1);
    }

    _glfwPlatformSetWindowTitle(window, wndconfig->title);

    XRRSelectInput(_glfw.x11.display, window->x11.handle,
                   RRScreenChangeNotifyMask);

    if (_glfw.x11.im)
    {
        window->x11.ic = XCreateIC(_glfw.x11.im,
                                   XNInputStyle,
                                   XIMPreeditNothing | XIMStatusNothing,
                                   XNClientWindow,
                                   window->x11.handle,
                                   XNFocusWindow,
                                   window->x11.handle,
                                   NULL);
    }

    _glfwPlatformGetWindowPos(window, &window->x11.xpos, &window->x11.ypos);
    _glfwPlatformGetWindowSize(window, &window->x11.width, &window->x11.height);

    return GL_TRUE;
}